

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O3

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  int iVar1;
  char fmt_s [3];
  char firstLine [512];
  undefined2 local_22c;
  undefined1 local_22a;
  undefined1 local_228 [511];
  undefined1 local_29;
  
  if (((_stdscr != 0) && (4 < *(short *)(_stdscr + 4) && 0x3f < *(short *)(_stdscr + 6))) &&
     ((this->super_cmCursesWidget).field_0x3c == '\x01')) {
    iVar1 = (int)*(short *)(_stdscr + 4);
    local_22a = 0;
    local_22c = 0x7325;
    memset(local_228,0x20,0x200);
    local_29 = 0;
    move(iVar1 + -3,0);
    printw(&local_22c,local_228);
    move(iVar1 + -2,0);
    printw(&local_22c,local_228);
    move(iVar1 + -1,0);
    printw(&local_22c,local_228);
    move(iVar1,0);
    printw(&local_22c,local_228);
    move(iVar1 + -2,0);
    printw(&local_22c,"Editing option, press [enter] to leave edit.");
    return true;
  }
  return false;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return false;
    }
  if (this->InEdit)
    {
    char fmt_s[] = "%s";
    char firstLine[512];
    // Clean the toolbar
    for(int i=0; i<512; i++)
      {
      firstLine[i] = ' ';
      }
    firstLine[511] = '\0';
    curses_move(y-4,0);
    printw(fmt_s, firstLine);
    curses_move(y-3,0);
    printw(fmt_s, firstLine);
    curses_move(y-2,0);
    printw(fmt_s, firstLine);
    curses_move(y-1,0);
    printw(fmt_s, firstLine);

    curses_move(y-3,0);
    printw(fmt_s, "Editing option, press [enter] to leave edit.");
    return true;
    }
  else
    {
    return false;
    }
}